

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-move.c
# Opt level: O3

_Bool get_move_find_safety(monster *mon)

{
  wchar_t *pwVar1;
  wchar_t *pwVar2;
  uint16_t **ppuVar3;
  _Bool _Var4;
  wchar_t wVar5;
  loc_conflict lVar6;
  loc_conflict grid2;
  loc grid;
  wchar_t x;
  ulong uVar7;
  long lVar8;
  int iVar9;
  _Bool _Var10;
  wchar_t local_64;
  ulong local_58;
  
  local_64 = L'\0';
  iVar9 = 1;
  _Var10 = true;
  uVar7 = 1;
  do {
    lVar6 = loc(0,0);
    pwVar1 = dist_offsets_y[uVar7];
    pwVar2 = dist_offsets_x[uVar7];
    wVar5 = *pwVar1;
    x = *pwVar2;
    if (x != L'\0' || wVar5 != L'\0') {
      local_58 = (ulong)lVar6 >> 0x20;
      lVar8 = 4;
      do {
        grid2 = loc(x,wVar5);
        grid = (loc)loc_sum(mon->grid,grid2);
        _Var4 = square_in_bounds_fully(cave,grid);
        if ((((_Var4) && (_Var4 = square_ispassable(cave,grid), _Var4)) &&
            (ppuVar3 = (cave->noise).grids,
            (uint)ppuVar3[(long)grid >> 0x20][grid.x] <=
            (uint)ppuVar3[(mon->grid).y][(mon->grid).x] + iVar9 * 2)) &&
           (((_Var4 = monster_hates_grid(mon,(loc_conflict)grid), !_Var4 &&
             (_Var4 = square_isview(cave,grid), !_Var4)) &&
            (wVar5 = distance((loc_conflict)grid,player->grid), local_64 < wVar5)))) {
          local_58 = (ulong)grid >> 0x20;
          lVar6 = (loc_conflict)((ulong)grid & 0xffffffff);
          local_64 = wVar5;
        }
        wVar5 = *(wchar_t *)((long)pwVar1 + lVar8);
        x = *(wchar_t *)((long)pwVar2 + lVar8);
        lVar8 = lVar8 + 4;
      } while (wVar5 != L'\0' || x != L'\0');
      if (L'\0' < local_64) {
        (mon->target).grid.x = lVar6.x;
        (mon->target).grid.y = (int)local_58;
        return _Var10;
      }
    }
    iVar9 = iVar9 + 1;
    _Var10 = uVar7 < 9;
    uVar7 = uVar7 + 1;
    if (uVar7 == 10) {
      return false;
    }
  } while( true );
}

Assistant:

static bool get_move_find_safety(struct monster *mon)
{
	int i, dy, dx, d, dis, gdis = 0;

	const int *y_offsets;
	const int *x_offsets;

	/* Start with adjacent locations, spread further */
	for (d = 1; d < 10; d++) {
		struct loc best = loc(0, 0);

		/* Get the lists of points with a distance d from (fx, fy) */
		y_offsets = dist_offsets_y[d];
		x_offsets = dist_offsets_x[d];

		/* Check the locations */
		for (i = 0, dx = x_offsets[0], dy = y_offsets[0];
		     dx != 0 || dy != 0;
		     i++, dx = x_offsets[i], dy = y_offsets[i]) {
			struct loc grid = loc_sum(mon->grid, loc(dx, dy));

			/* Skip illegal locations */
			if (!square_in_bounds_fully(cave, grid)) continue;

			/* Skip locations in a wall */
			if (!square_ispassable(cave, grid)) continue;

			/* Ignore too-distant grids */
			if (cave->noise.grids[grid.y][grid.x] >
				cave->noise.grids[mon->grid.y][mon->grid.x] + 2 * d)
				continue;

			/* Ignore damaging terrain if they can't handle it */
			if (monster_hates_grid(mon, grid)) continue;

			/* Check for absence of shot (more or less) */
			if (!square_isview(cave, grid)) {
				/* Calculate distance from player */
				dis = distance(grid, player->grid);

				/* Remember if further than previous */
				if (dis > gdis) {
					best = grid;
					gdis = dis;
				}
			}
		}

		/* Check for success */
		if (gdis > 0) {
			/* Good location */
			mon->target.grid = best;
			return (true);
		}
	}

	/* No safe place */
	return (false);
}